

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O3

ArrayPtr<capnp::word> __thiscall
capnp::MallocMessageBuilder::allocateSegment(MallocMessageBuilder *this,uint minimumSize)

{
  RemoveConst<void_*> **pppvVar1;
  bool bVar2;
  uint uVar3;
  RemoveConst<void_*> *ppvVar4;
  uint uVar5;
  word *pwVar6;
  RemoveConst<void_*> *ppvVar7;
  uint uVar8;
  ulong __nmemb;
  size_t newSize;
  ArrayPtr<capnp::word> AVar9;
  Fault f;
  uint size;
  Fault local_30;
  uint local_24;
  
  if (0x1fffffff < minimumSize) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xed,FAILED,"bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS",
               "\"MallocMessageBuilder asked to allocate segment above maximum serializable size.\""
               ,(char (*) [80])
                "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  uVar8 = *(uint *)&(this->super_MessageBuilder).field_0xbc;
  __nmemb = (ulong)uVar8;
  if (0x1fffffff < __nmemb) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xef,FAILED,"bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS",
               "\"MallocMessageBuilder nextSize out of bounds.\"",
               (char (*) [45])"MallocMessageBuilder nextSize out of bounds.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  bVar2 = this->returnedFirstSegment;
  if ((bVar2 == false) && (this->ownFirstSegment == false)) {
    if (minimumSize <= uVar8) {
      pwVar6 = (word *)this->firstSegment;
      this->returnedFirstSegment = true;
      goto LAB_001cf80d;
    }
    this->ownFirstSegment = true;
  }
  if (uVar8 < minimumSize) {
    __nmemb = (ulong)minimumSize;
  }
  uVar8 = (uint)__nmemb;
  local_24 = uVar8;
  pwVar6 = (word *)calloc(__nmemb,8);
  if (pwVar6 == (word *)0x0) {
    kj::_::Debug::Fault::Fault<int,unsigned_int&>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0x101,0xc,"calloc(size, sizeof(word))","size",&local_24);
    kj::_::Debug::Fault::fatal(&local_30);
  }
  if (bVar2 == false) {
    this->firstSegment = pwVar6;
    this->returnedFirstSegment = true;
    uVar5 = uVar8;
    if (this->allocationStrategy != GROW_HEURISTICALLY) goto LAB_001cf80d;
  }
  else {
    ppvVar7 = (this->moreSegments).builder.pos;
    if (ppvVar7 == (this->moreSegments).builder.endPtr) {
      ppvVar4 = (this->moreSegments).builder.ptr;
      newSize = 4;
      if (ppvVar7 != ppvVar4) {
        newSize = (long)ppvVar7 - (long)ppvVar4 >> 2;
      }
      kj::Vector<void_*>::setCapacity(&this->moreSegments,newSize);
      ppvVar7 = (this->moreSegments).builder.pos;
    }
    *ppvVar7 = pwVar6;
    pppvVar1 = &(this->moreSegments).builder.pos;
    *pppvVar1 = *pppvVar1 + 1;
    if (this->allocationStrategy != GROW_HEURISTICALLY) goto LAB_001cf80d;
    uVar3 = *(uint *)&(this->super_MessageBuilder).field_0xbc;
    uVar5 = 0x1fffffff;
    if (__nmemb <= 0x1fffffff - (ulong)uVar3) {
      uVar5 = uVar8 + uVar3;
    }
  }
  *(uint *)&(this->super_MessageBuilder).field_0xbc = uVar5;
LAB_001cf80d:
  AVar9.size_ = __nmemb;
  AVar9.ptr = pwVar6;
  return AVar9;
}

Assistant:

kj::ArrayPtr<word> MallocMessageBuilder::allocateSegment(uint minimumSize) {
  KJ_REQUIRE(bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
  KJ_ASSERT(bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder nextSize out of bounds.");

  if (!returnedFirstSegment && !ownFirstSegment) {
    kj::ArrayPtr<word> result = kj::arrayPtr(reinterpret_cast<word*>(firstSegment), nextSize);
    if (result.size() >= minimumSize) {
      returnedFirstSegment = true;
      return result;
    }
    // If the provided first segment wasn't big enough, we discard it and proceed to allocate
    // our own.  This never happens in practice since minimumSize is always 1 for the first
    // segment.
    ownFirstSegment = true;
  }

  uint size = kj::max(minimumSize, nextSize);

  void* result = calloc(size, sizeof(word));
  if (result == nullptr) {
    KJ_FAIL_SYSCALL("calloc(size, sizeof(word))", ENOMEM, size);
  }

  if (!returnedFirstSegment) {
    firstSegment = result;
    returnedFirstSegment = true;

    // After the first segment, we want nextSize to equal the total size allocated so far.
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) nextSize = size;
  } else {
    moreSegments.add(result);
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) {
      // set nextSize = min(nextSize+size, MAX_SEGMENT_WORDS)
      // while protecting against possible overflow of (nextSize+size)
      nextSize = (size <= unbound(MAX_SEGMENT_WORDS / WORDS) - nextSize)
          ? nextSize + size : unbound(MAX_SEGMENT_WORDS / WORDS);
    }
  }

  return kj::arrayPtr(reinterpret_cast<word*>(result), size);
}